

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-contact-ekf-flex-estimator-imu.cpp
# Opt level: O2

Vector * __thiscall
stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::getFlexibilityVector
          (FixedContactEKFFlexEstimatorIMU *this)

{
  ExtendedKalmanFilter *this_00;
  Vector *dst;
  uint uVar1;
  Vector *src;
  Matrix<double,__1,_1,_0,__1,_1> local_c8;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_b8 [24];
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_a0;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> local_68 [56];
  
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  uVar1 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)this_00);
  if (uVar1 != 0) {
    src = EKFFlexibilityEstimatorBase::getFlexibilityVector
                    (&this->super_EKFFlexibilityEstimatorBase);
    dst = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(dst,src);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,dst,3,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>(local_b8,local_68);
    kine::regulateOrientationVector((kine *)&local_c8,(Vector3 *)local_b8);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_a0,dst,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&local_a0.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_c8
              );
    free(local_c8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    uVar1 = ZeroDelayObserver::getCurrentTime((ZeroDelayObserver *)this_00);
    ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,dst,uVar1);
  }
  return &(this->super_EKFFlexibilityEstimatorBase).lastX_;
}

Assistant:

const Vector& FixedContactEKFFlexEstimatorIMU::getFlexibilityVector()
    {
        if (ekf_.getMeasurementsNumber()>0)
        {
            lastX_ =EKFFlexibilityEstimatorBase::getFlexibilityVector();

            ///regulate the part of orientation vector in the state vector
            lastX_.segment(kine::ori,3)=
                kine::regulateOrientationVector(lastX_.segment(kine::ori,3));

            ekf_.setState(lastX_,ekf_.getCurrentTime());
        }
        return lastX_;
    }